

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void __thiscall
LinkedReadsDatastore::get_tags_kmers128(int,int,std::set<unsigned_int,std::less<unsigned_int>,std::
allocator<unsigned_int>>,ReadSequenceBuffer&,bool)::StreamKmerFactory128::
produce_all_kmers(char_const*,std::vector<unsigned__int128,std::allocator<unsigned__int128>_>__
          (void *this,char *seq,vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned___int128 *__args;
  iterator __position;
  ulong uVar6;
  bool bVar7;
  
  *(undefined8 *)((long)this + 0x18) = 0;
  *(undefined8 *)((long)this + 0x20) = 0;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined8 *)((long)this + 0x10) = 0;
  *(undefined8 *)((long)this + 0x28) = 0;
  do {
    bVar1 = *seq;
    if ((bVar1 == 0) || (bVar1 == 10)) {
      return;
    }
    cVar2 = *(char *)((long)this + (ulong)bVar1 + 0x50);
    if (cVar2 == '\x04') {
      *(undefined8 *)((long)this + 8) = 0;
      uVar3 = *(ulong *)((long)this + 0x20);
      *(ulong *)((long)this + 0x20) = uVar3 << 2 & *(ulong *)((long)this + 0x30);
      *(ulong *)((long)this + 0x28) =
           (*(long *)((long)this + 0x28) << 2 | uVar3 >> 0x3e) & *(ulong *)((long)this + 0x38);
      bVar1 = *(byte *)((long)this + 0x40);
      uVar5 = *(ulong *)((long)this + 0x10) >> 2 | *(ulong *)((long)this + 0x18) << 0x3e;
      uVar6 = 3L << (bVar1 & 0x3f);
      uVar4 = uVar6;
      uVar3 = 0L << (bVar1 & 0x3f) | 3UL >> 0x40 - (bVar1 & 0x3f);
      if ((bVar1 & 0x40) != 0) {
        uVar4 = 0;
        uVar3 = uVar6;
      }
      *(ulong *)((long)this + 0x10) = uVar4 + uVar5;
      *(ulong *)((long)this + 0x18) =
           uVar3 + (*(ulong *)((long)this + 0x18) >> 2) + (ulong)CARRY8(uVar4,uVar5);
    }
    else {
      uVar3 = *(ulong *)((long)this + 0x20);
      uVar5 = uVar3 * 4;
      uVar4 = (ulong)cVar2;
      *(ulong *)((long)this + 0x20) = uVar5 + uVar4 & *(ulong *)((long)this + 0x30);
      *(ulong *)((long)this + 0x28) =
           ((long)uVar4 >> 0x3f) + (*(long *)((long)this + 0x28) << 2 | uVar3 >> 0x3e) +
           (ulong)CARRY8(uVar5,uVar4) & *(ulong *)((long)this + 0x38);
      uVar5 = *(ulong *)((long)this + 0x10) >> 2 | *(ulong *)((long)this + 0x18) << 0x3e;
      uVar3 = (ulong)*(char *)((long)this + (ulong)bVar1 + 0x150);
      bVar1 = *(byte *)((long)this + 0x40);
      uVar4 = uVar3 << (bVar1 & 0x3f);
      bVar7 = (bVar1 & 0x40) != 0;
      uVar3 = ((long)uVar3 >> 0x3f) << (bVar1 & 0x3f) | uVar3 >> 0x40 - (bVar1 & 0x3f);
      if (bVar7) {
        uVar3 = uVar4;
      }
      uVar6 = 0;
      if (!bVar7) {
        uVar6 = uVar4;
      }
      *(ulong *)((long)this + 0x10) = uVar6 + uVar5;
      *(ulong *)((long)this + 0x18) =
           uVar3 + (*(ulong *)((long)this + 0x18) >> 2) + (ulong)CARRY8(uVar6,uVar5);
      *(long *)((long)this + 8) = *(long *)((long)this + 8) + 1;
    }
    if ((long)(ulong)*this <= *(long *)((long)this + 8)) {
      uVar3 = *(ulong *)((long)this + 0x10);
      uVar4 = *(ulong *)((long)this + 0x18);
      uVar5 = *(ulong *)((long)this + 0x20);
      uVar6 = *(ulong *)((long)this + 0x28);
      if (uVar6 < uVar4 || uVar6 - uVar4 < (ulong)(uVar5 < uVar3)) {
        __position._M_current =
             (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        __args = (unsigned___int128 *)((long)this + 0x20);
        if (__position._M_current ==
            (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0018fe64:
          std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
          _M_realloc_insert<unsigned__int128&>
                    ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)mers,__position,
                     __args);
          goto LAB_0018fe69;
        }
        *(ulong *)__position._M_current = uVar5;
        *(ulong *)((long)__position._M_current + 8) = uVar6;
      }
      else {
        __position._M_current =
             (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        __args = (unsigned___int128 *)((long)this + 0x10);
        if (__position._M_current ==
            (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0018fe64;
        *(ulong *)__position._M_current = uVar3;
        *(ulong *)((long)__position._M_current + 8) = uVar4;
      }
      (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
LAB_0018fe69:
    seq = (char *)((byte *)seq + 1);
  } while( true );
}

Assistant:

inline void produce_all_kmers(const char * seq, std::vector<__uint128_t> &mers){
            // TODO: Adjust for when K is larger than what fits in __uint128_t!
            last_unknown=0;
            fkmer=0;
            rkmer=0;
            auto s=seq;
            while (*s!='\0' and *s!='\n') {
                //fkmer: grows from the right (LSB)
                //rkmer: grows from the left (MSB)
                fillKBuf(*s, fkmer, rkmer, last_unknown);
                if (last_unknown >= K) {
                    if (fkmer <= rkmer) {
                        // Is fwd
                        mers.emplace_back(fkmer);
                    } else {
                        // Is bwd
                        mers.emplace_back(rkmer);
                    }
                }
                ++s;
            }
        }